

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DSectorScrollInterpolation::DSectorScrollInterpolation
          (DSectorScrollInterpolation *this,sector_t_conflict *_sector,bool _plane)

{
  bool _plane_local;
  sector_t_conflict *_sector_local;
  DSectorScrollInterpolation *this_local;
  
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a09850;
  this->sector = _sector;
  this->ceiling = _plane;
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])();
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DSectorScrollInterpolation::DSectorScrollInterpolation(sector_t *_sector, bool _plane)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}